

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
* __thiscall
tinyusdz::lerp<std::array<tinyusdz::value::half,2ul>>
          (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          *a,vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
             *b,double t)

{
  half2 hVar1;
  ulong uVar2;
  ulong __new_size;
  long lVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(long *)(this + 8) - *(long *)this >> 2;
  __new_size = (long)(a->
                     super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 2;
  if (uVar2 <= __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    std::
    vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::resize(__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      do {
        hVar1 = lerp<std::array<tinyusdz::value::half,2ul>>
                          ((half2 *)(*(long *)this + lVar3),
                           (half2 *)((long)&((a->
                                             super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->_M_elems
                                            [0].value + lVar3),t);
        *(_Type *)((long)&((__return_storage_ptr__->
                           super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].value + lVar3) =
             hVar1._M_elems;
        lVar3 = lVar3 + 4;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}